

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_64x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int8_t *piVar16;
  int8_t cos_bit;
  undefined1 *puVar17;
  int iVar18;
  int32_t *piVar19;
  ulong *puVar20;
  long lVar21;
  uint uVar22;
  int32_t *piVar23;
  uint uVar24;
  long lVar25;
  ulong *puVar26;
  long lVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i in [256];
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  ulong auStack_1118 [2];
  ulong auStack_1108 [2];
  undefined8 auStack_10f8 [2];
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  ulong auStack_10d8 [2];
  ulong auStack_10c8 [2];
  undefined8 auStack_10b8 [2];
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  ulong auStack_1098 [2];
  ulong auStack_1088 [2];
  undefined8 auStack_1078 [2];
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  ulong auStack_1058 [2];
  undefined8 local_1048;
  int16_t *local_1040;
  longlong local_1038 [24];
  undefined1 local_f78 [3912];
  
  piVar16 = av1_fwd_txfm_shift_ls[0x12];
  local_1048._4_4_ = 0xd;
  bVar28 = tx_type < 0x10;
  uVar22 = 0xbeaf >> (tx_type & 0x1f);
  uVar24 = 0x7f1f >> (tx_type & 0x1f);
  local_1048._3_1_ = '\f';
  local_1040 = input + 0x10;
  lVar27 = 0xf0;
  lVar25 = 0;
  puVar26 = (ulong *)input;
  do {
    lVar21 = lVar25 * stride;
    iVar18 = (int)*av1_fwd_txfm_shift_ls[0x12];
    if ((uVar22 & 1) == 0 && bVar28) {
      *(ulong *)((long)&uStack_1128 + lVar27) = puVar26[3];
      *(undefined8 *)((long)&uStack_1120 + lVar27) = 0;
      *(ulong *)((long)auStack_1118 + lVar27) = puVar26[2];
      *(undefined8 *)((long)auStack_1118 + lVar27 + 8) = 0;
      *(ulong *)((long)auStack_1108 + lVar27) = puVar26[1];
      *(undefined8 *)((long)auStack_1108 + lVar27 + 8) = 0;
      puVar20 = puVar26;
    }
    else {
      *(ulong *)((long)&uStack_1128 + lVar27) = *puVar26;
      *(undefined8 *)((long)&uStack_1120 + lVar27) = 0;
      *(ulong *)((long)auStack_1118 + lVar27) = puVar26[1];
      *(undefined8 *)((long)auStack_1118 + lVar27 + 8) = 0;
      *(ulong *)((long)auStack_1108 + lVar27) = puVar26[2];
      *(undefined8 *)((long)auStack_1108 + lVar27 + 8) = 0;
      puVar20 = (ulong *)(input + lVar21 + 0xc);
    }
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *puVar20;
    *(undefined1 (*) [16])((long)auStack_10f8 + lVar27) = auVar29;
    if ((uVar24 & 1) == 0 && bVar28) {
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)&uStack_1128 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)&uStack_1128 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_1118 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_1118 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_1108 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_1108 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_10f8 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_10f8 + lVar27) = auVar29;
    }
    auVar29 = pmovsxwd(auVar29,*(undefined8 *)((long)&uStack_1128 + lVar27));
    auVar32 = pmovsxwd(in_XMM1,*(undefined8 *)((long)auStack_1118 + lVar27));
    auVar36 = pmovsxwd(in_XMM2,*(undefined8 *)((long)auStack_1108 + lVar27));
    auVar39 = pmovsxwd(in_XMM3,*(undefined8 *)((long)auStack_10f8 + lVar27));
    *(int *)((long)&uStack_1128 + lVar27) = auVar29._0_4_ << iVar18;
    *(int *)((long)&uStack_1128 + lVar27 + 4) = auVar29._4_4_;
    *(int *)((long)&uStack_1120 + lVar27) = auVar29._8_4_;
    *(int *)((long)auStack_1118 + lVar27 + -4) = auVar29._12_4_;
    auVar33._0_4_ = auVar32._0_4_ << iVar18;
    auVar33._4_4_ = auVar32._4_4_;
    auVar33._8_4_ = auVar32._8_4_;
    auVar33._12_4_ = auVar32._12_4_;
    *(undefined1 (*) [16])((long)auStack_1118 + lVar27) = auVar33;
    auVar32._0_4_ = auVar36._0_4_ << iVar18;
    auVar32._4_4_ = auVar36._4_4_;
    auVar32._8_4_ = auVar36._8_4_;
    auVar32._12_4_ = auVar36._12_4_;
    auVar36._0_4_ = auVar39._0_4_ << iVar18;
    auVar36._4_4_ = auVar39._4_4_;
    auVar36._8_4_ = auVar39._8_4_;
    auVar36._12_4_ = auVar39._12_4_;
    *(undefined1 (*) [16])((long)auStack_1108 + lVar27) = auVar32;
    *(undefined1 (*) [16])((long)auStack_10f8 + lVar27) = auVar36;
    iVar18 = (int)*av1_fwd_txfm_shift_ls[0x12];
    if ((uVar22 & 1) == 0 && bVar28) {
      puVar20 = puVar26 + 4;
      *(ulong *)((long)&uStack_10e8 + lVar27) = puVar26[7];
      *(undefined8 *)((long)&uStack_10e0 + lVar27) = 0;
      *(ulong *)((long)auStack_10d8 + lVar27) = puVar26[6];
      *(undefined8 *)((long)auStack_10d8 + lVar27 + 8) = 0;
      *(ulong *)((long)auStack_10c8 + lVar27) = puVar26[5];
      *(undefined8 *)((long)auStack_10c8 + lVar27 + 8) = 0;
    }
    else {
      *(ulong *)((long)&uStack_10e8 + lVar27) = puVar26[4];
      *(undefined8 *)((long)&uStack_10e0 + lVar27) = 0;
      *(ulong *)((long)auStack_10d8 + lVar27) = puVar26[5];
      *(undefined8 *)((long)auStack_10d8 + lVar27 + 8) = 0;
      *(ulong *)((long)auStack_10c8 + lVar27) = puVar26[6];
      *(undefined8 *)((long)auStack_10c8 + lVar27 + 8) = 0;
      puVar20 = (ulong *)(local_1040 + lVar21 + 0xc);
    }
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *puVar20;
    *(undefined1 (*) [16])((long)auStack_10b8 + lVar27) = auVar39;
    if ((uVar24 & 1) == 0 && bVar28) {
      auVar29 = pshuflw(auVar39,*(undefined1 (*) [16])((long)&uStack_10e8 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)&uStack_10e8 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_10d8 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_10d8 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_10c8 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_10c8 + lVar27) = auVar29;
      auVar39 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_10b8 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_10b8 + lVar27) = auVar39;
    }
    auVar29 = pmovsxwd(auVar39,*(undefined8 *)((long)&uStack_10e8 + lVar27));
    auVar33 = pmovsxwd(auVar33,*(undefined8 *)((long)auStack_10d8 + lVar27));
    auVar32 = pmovsxwd(auVar32,*(undefined8 *)((long)auStack_10c8 + lVar27));
    auVar36 = pmovsxwd(auVar36,*(undefined8 *)((long)auStack_10b8 + lVar27));
    *(int *)((long)&uStack_10e8 + lVar27) = auVar29._0_4_ << iVar18;
    *(int *)((long)&uStack_10e8 + lVar27 + 4) = auVar29._4_4_;
    *(int *)((long)&uStack_10e0 + lVar27) = auVar29._8_4_;
    *(int *)((long)auStack_10d8 + lVar27 + -4) = auVar29._12_4_;
    auVar34._0_4_ = auVar33._0_4_ << iVar18;
    auVar34._4_4_ = auVar33._4_4_;
    auVar34._8_4_ = auVar33._8_4_;
    auVar34._12_4_ = auVar33._12_4_;
    *(undefined1 (*) [16])((long)auStack_10d8 + lVar27) = auVar34;
    auVar37._0_4_ = auVar32._0_4_ << iVar18;
    auVar37._4_4_ = auVar32._4_4_;
    auVar37._8_4_ = auVar32._8_4_;
    auVar37._12_4_ = auVar32._12_4_;
    auVar40._0_4_ = auVar36._0_4_ << iVar18;
    auVar40._4_4_ = auVar36._4_4_;
    auVar40._8_4_ = auVar36._8_4_;
    auVar40._12_4_ = auVar36._12_4_;
    *(undefined1 (*) [16])((long)auStack_10c8 + lVar27) = auVar37;
    *(undefined1 (*) [16])((long)auStack_10b8 + lVar27) = auVar40;
    iVar18 = (int)*av1_fwd_txfm_shift_ls[0x12];
    if ((uVar22 & 1) == 0 && bVar28) {
      puVar20 = puVar26 + 8;
      *(ulong *)((long)&uStack_10a8 + lVar27) = puVar26[0xb];
      *(undefined8 *)((long)&uStack_10a0 + lVar27) = 0;
      *(ulong *)((long)auStack_1098 + lVar27) = puVar26[10];
      *(undefined8 *)((long)auStack_1098 + lVar27 + 8) = 0;
      *(ulong *)((long)auStack_1088 + lVar27) = puVar26[9];
      *(undefined8 *)((long)auStack_1088 + lVar27 + 8) = 0;
    }
    else {
      *(ulong *)((long)&uStack_10a8 + lVar27) = puVar26[8];
      *(undefined8 *)((long)&uStack_10a0 + lVar27) = 0;
      *(ulong *)((long)auStack_1098 + lVar27) = puVar26[9];
      *(undefined8 *)((long)auStack_1098 + lVar27 + 8) = 0;
      *(ulong *)((long)auStack_1088 + lVar27) = puVar26[10];
      *(undefined8 *)((long)auStack_1088 + lVar27 + 8) = 0;
      puVar20 = (ulong *)(input + lVar21 + 0x2c);
    }
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *puVar20;
    *(undefined1 (*) [16])((long)auStack_1078 + lVar27) = auVar30;
    if ((uVar24 & 1) == 0 && bVar28) {
      auVar29 = pshuflw(auVar30,*(undefined1 (*) [16])((long)&uStack_10a8 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)&uStack_10a8 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_1098 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_1098 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_1088 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_1088 + lVar27) = auVar29;
      auVar30 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_1078 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_1078 + lVar27) = auVar30;
    }
    auVar29 = pmovsxwd(auVar30,*(undefined8 *)((long)&uStack_10a8 + lVar27));
    auVar32 = pmovsxwd(auVar34,*(undefined8 *)((long)auStack_1098 + lVar27));
    auVar33 = pmovsxwd(auVar37,*(undefined8 *)((long)auStack_1088 + lVar27));
    auVar36 = pmovsxwd(auVar40,*(undefined8 *)((long)auStack_1078 + lVar27));
    *(int *)((long)&uStack_10a8 + lVar27) = auVar29._0_4_ << iVar18;
    *(int *)((long)&uStack_10a8 + lVar27 + 4) = auVar29._4_4_;
    *(int *)((long)&uStack_10a0 + lVar27) = auVar29._8_4_;
    *(int *)((long)auStack_1098 + lVar27 + -4) = auVar29._12_4_;
    auVar35._0_4_ = auVar32._0_4_ << iVar18;
    auVar35._4_4_ = auVar32._4_4_;
    auVar35._8_4_ = auVar32._8_4_;
    auVar35._12_4_ = auVar32._12_4_;
    *(undefined1 (*) [16])((long)auStack_1098 + lVar27) = auVar35;
    auVar38._0_4_ = auVar33._0_4_ << iVar18;
    auVar38._4_4_ = auVar33._4_4_;
    auVar38._8_4_ = auVar33._8_4_;
    auVar38._12_4_ = auVar33._12_4_;
    auVar41._0_4_ = auVar36._0_4_ << iVar18;
    auVar41._4_4_ = auVar36._4_4_;
    auVar41._8_4_ = auVar36._8_4_;
    auVar41._12_4_ = auVar36._12_4_;
    *(undefined1 (*) [16])((long)auStack_1088 + lVar27) = auVar38;
    *(undefined1 (*) [16])((long)auStack_1078 + lVar27) = auVar41;
    iVar18 = (int)*av1_fwd_txfm_shift_ls[0x12];
    if ((uVar22 & 1) == 0 && bVar28) {
      puVar20 = puVar26 + 0xc;
      *(ulong *)((long)&uStack_1068 + lVar27) = puVar26[0xf];
      *(undefined8 *)((long)&uStack_1060 + lVar27) = 0;
      *(ulong *)((long)auStack_1058 + lVar27) = puVar26[0xe];
      *(undefined8 *)((long)auStack_1058 + lVar27 + 8) = 0;
      *(ulong *)((long)&local_1048 + lVar27) = puVar26[0xd];
      *(undefined8 *)((long)local_1038 + lVar27 + -8) = 0;
    }
    else {
      *(ulong *)((long)&uStack_1068 + lVar27) = puVar26[0xc];
      *(undefined8 *)((long)&uStack_1060 + lVar27) = 0;
      *(ulong *)((long)auStack_1058 + lVar27) = puVar26[0xd];
      *(undefined8 *)((long)auStack_1058 + lVar27 + 8) = 0;
      *(ulong *)((long)&local_1048 + lVar27) = puVar26[0xe];
      *(undefined8 *)((long)local_1038 + lVar27 + -8) = 0;
      puVar20 = (ulong *)(input + lVar21 + 0x3c);
    }
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *puVar20;
    *(undefined1 (*) [16])((long)local_1038 + lVar27) = auVar31;
    if ((uVar24 & 1) == 0 && bVar28) {
      auVar29 = pshuflw(auVar31,*(undefined1 (*) [16])((long)&uStack_1068 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)&uStack_1068 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)auStack_1058 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)auStack_1058 + lVar27) = auVar29;
      auVar29 = pshuflw(auVar29,*(undefined1 (*) [16])((long)&local_1048 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)&local_1048 + lVar27) = auVar29;
      auVar31 = pshuflw(auVar29,*(undefined1 (*) [16])((long)local_1038 + lVar27),0x1b);
      *(undefined1 (*) [16])((long)local_1038 + lVar27) = auVar31;
    }
    auVar29 = pmovsxwd(auVar31,*(undefined8 *)((long)&uStack_1068 + lVar27));
    auVar32 = pmovsxwd(auVar35,*(undefined8 *)((long)auStack_1058 + lVar27));
    auVar33 = pmovsxwd(auVar38,*(undefined8 *)((long)&local_1048 + lVar27));
    auVar36 = pmovsxwd(auVar41,*(undefined8 *)((long)local_1038 + lVar27));
    in_XMM1._0_4_ = auVar32._0_4_ << iVar18;
    in_XMM1._4_4_ = auVar32._4_4_;
    in_XMM1._8_4_ = auVar32._8_4_;
    in_XMM1._12_4_ = auVar32._12_4_;
    *(int *)((long)&uStack_1068 + lVar27) = auVar29._0_4_ << iVar18;
    *(int *)((long)&uStack_1068 + lVar27 + 4) = auVar29._4_4_;
    *(int *)((long)&uStack_1060 + lVar27) = auVar29._8_4_;
    *(int *)((long)auStack_1058 + lVar27 + -4) = auVar29._12_4_;
    *(undefined1 (*) [16])((long)auStack_1058 + lVar27) = in_XMM1;
    in_XMM2._0_4_ = auVar33._0_4_ << iVar18;
    in_XMM2._4_4_ = auVar33._4_4_;
    in_XMM2._8_4_ = auVar33._8_4_;
    in_XMM2._12_4_ = auVar33._12_4_;
    *(undefined1 (*) [16])((long)&local_1048 + lVar27) = in_XMM2;
    in_XMM3._0_4_ = auVar36._0_4_ << iVar18;
    in_XMM3._4_4_ = auVar36._4_4_;
    in_XMM3._8_4_ = auVar36._8_4_;
    in_XMM3._12_4_ = auVar36._12_4_;
    *(undefined1 (*) [16])((long)local_1038 + lVar27) = in_XMM3;
    lVar25 = lVar25 + 1;
    puVar26 = (ulong *)((long)puVar26 + (long)stride * 2);
    lVar27 = lVar27 + 0x100;
  } while (lVar27 != 0x10f0);
  auStack_1058[1] = 0x3d79e5;
  fdct16x16_sse4_1((__m128i *)local_1038,(__m128i *)coeff,0xd,0x10);
  auStack_1058[1] = 0x3d79f4;
  col_txfm_16x16_rounding((__m128i *)coeff,-(int)piVar16[1]);
  auStack_1058[1] = 0x3d7a07;
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x100),-(int)piVar16[1]);
  auStack_1058[1] = 0x3d7a1d;
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x200),-(int)piVar16[1]);
  auStack_1058[1] = 0x3d7a30;
  col_txfm_16x16_rounding((__m128i *)(coeff + 0x300),-(int)piVar16[1]);
  cos_bit = local_1048._3_1_;
  puVar17 = local_f78;
  piVar19 = coeff + 0xc0;
  lVar25 = 0;
  do {
    lVar27 = -0x40;
    piVar23 = piVar19;
    do {
      iVar9 = piVar23[-0xbf];
      iVar10 = piVar23[-0xbe];
      iVar11 = piVar23[-0xbd];
      iVar2 = piVar23[-0x7f];
      iVar3 = piVar23[-0x7e];
      iVar4 = piVar23[-0x7d];
      iVar12 = piVar23[-0x40];
      iVar13 = piVar23[-0x3f];
      iVar14 = piVar23[-0x3e];
      iVar15 = piVar23[-0x3d];
      iVar5 = *piVar23;
      iVar6 = piVar23[1];
      iVar7 = piVar23[2];
      iVar8 = piVar23[3];
      *(ulong *)(puVar17 + lVar27 + -0x80) = CONCAT44(piVar23[-0x80],piVar23[-0xc0]);
      *(ulong *)((long)(puVar17 + lVar27 + -0x80) + 8) = CONCAT44(iVar5,iVar12);
      *(int32_t *)(puVar17 + lVar27 + -0x38) = iVar9;
      *(int32_t *)(puVar17 + lVar27 + -0x34) = iVar2;
      *(int32_t *)(puVar17 + lVar27 + -0x30) = iVar13;
      *(int32_t *)(puVar17 + lVar27 + -0x2c) = iVar6;
      piVar1 = (int32_t *)(puVar17 + lVar27);
      *piVar1 = iVar10;
      piVar1[1] = iVar3;
      piVar1[2] = iVar14;
      piVar1[3] = iVar7;
      *(int32_t *)(puVar17 + lVar27 + 0x48) = iVar11;
      *(int32_t *)(puVar17 + lVar27 + 0x4c) = iVar4;
      *(int32_t *)(puVar17 + lVar27 + 0x50) = iVar15;
      *(int32_t *)(puVar17 + lVar27 + 0x54) = iVar8;
      piVar23 = piVar23 + 0x100;
      lVar27 = lVar27 + 0x10;
    } while (lVar27 != 0);
    lVar25 = lVar25 + 1;
    puVar17 = puVar17 + 0x100;
    piVar19 = piVar19 + 4;
  } while (lVar25 != 0x10);
  lVar25 = 0;
  do {
    auStack_1058[1] = 0x3d7af8;
    av1_fdct64_sse4_1((__m128i *)((long)local_1038 + lVar25),(__m128i *)((long)coeff + lVar25),
                      cos_bit,4,4);
    lVar25 = lVar25 + 0x10;
  } while (lVar25 != 0x40);
  auStack_1058[1] = 0x3d7b11;
  memset((__m128i *)(coeff + 0x200),0,0x800);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[256];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_64X16];
  const int txw_idx = get_txw_idx(TX_64X16);
  const int txh_idx = get_txh_idx(TX_64X16);
  const int txfm_size_col = tx_size_wide[TX_64X16];
  const int txfm_size_row = tx_size_high[TX_64X16];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col tranform
  for (int i = 0; i < txfm_size_row; i++) {
    load_buffer_4x4(input + 0 + i * stride, in + 0 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 16 + i * stride, in + 4 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 32 + i * stride, in + 8 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
    load_buffer_4x4(input + 48 + i * stride, in + 12 + i * txfm_size_row, 4,
                    ud_flip, lr_flip, shift[0]);
  }

  fdct16x16_sse4_1(in, outcoeff128, bitcol, txfm_size_row);
  col_txfm_16x16_rounding(outcoeff128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 64, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 128, -shift[1]);
  col_txfm_16x16_rounding(outcoeff128 + 192, -shift[1]);

  transpose_8nx8n(outcoeff128, in, txfm_size_col, txfm_size_row);
  for (int i = 0; i < 4; i++) {
    av1_fdct64_sse4_1(in + i, outcoeff128 + i, bitrow, 4, 4);
  }
  memset(coeff + txfm_size_row * 32, 0, txfm_size_row * 32 * sizeof(*coeff));
  (void)bd;
}